

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

bool __thiscall QOpenGLShaderProgram::addShader(QOpenGLShaderProgram *this,QOpenGLShader *shader)

{
  bool bVar1;
  uint uVar2;
  GLuint GVar3;
  QOpenGLShaderProgramPrivate *pQVar4;
  QOpenGLShaderPrivate *pQVar5;
  QOpenGLContextGroup *this_00;
  QOpenGLContextGroup *pQVar6;
  EVP_PKEY_CTX *in_RSI;
  QOpenGLShaderProgram *in_RDI;
  long in_FS_OFFSET;
  QOpenGLShaderProgramPrivate *d;
  GLuint in_stack_ffffffffffffff88;
  GLuint in_stack_ffffffffffffff8c;
  QListSpecialMethodsBase<QOpenGLShader_*> *in_stack_ffffffffffffff90;
  int line;
  QOpenGLExtraFunctions *this_01;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  bool local_39;
  QObject local_38 [8];
  char local_30 [32];
  EVP_PKEY_CTX *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  pQVar4 = d_func((QOpenGLShaderProgram *)0x17330f);
  uVar2 = init(in_RDI,in_RSI);
  if ((uVar2 & 1) == 0) {
    local_39 = false;
  }
  else {
    bVar1 = QListSpecialMethodsBase<QOpenGLShader*>::contains<QOpenGLShader*>
                      (in_stack_ffffffffffffff90,
                       (QOpenGLShader **)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    if (bVar1) {
      local_39 = true;
    }
    else {
      if (pQVar4->programGuard != (QOpenGLSharedResourceGuard *)0x0) {
        GVar3 = QOpenGLSharedResourceGuard::id(pQVar4->programGuard);
        if ((GVar3 != 0) && (local_10 != (EVP_PKEY_CTX *)0x0)) {
          pQVar5 = QOpenGLShader::d_func((QOpenGLShader *)0x17338f);
          if (pQVar5->shaderGuard != (QOpenGLSharedResourceGuard *)0x0) {
            pQVar5 = QOpenGLShader::d_func((QOpenGLShader *)0x1733a0);
            GVar3 = QOpenGLSharedResourceGuard::id(pQVar5->shaderGuard);
            if (GVar3 != 0) {
              this_00 = QOpenGLSharedResource::group((QOpenGLSharedResource *)pQVar4->programGuard);
              pQVar5 = QOpenGLShader::d_func((QOpenGLShader *)0x1733d5);
              pQVar6 = QOpenGLSharedResource::group((QOpenGLSharedResource *)pQVar5->shaderGuard);
              if (this_00 == pQVar6) {
                this_01 = pQVar4->glfuncs;
                QOpenGLSharedResourceGuard::id(pQVar4->programGuard);
                pQVar5 = QOpenGLShader::d_func((QOpenGLShader *)0x173448);
                QOpenGLSharedResourceGuard::id(pQVar5->shaderGuard);
                QOpenGLFunctions::glAttachShader
                          ((QOpenGLFunctions *)this_01,in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff88);
                pQVar4->linked = false;
                QList<QOpenGLShader_*>::append
                          ((QList<QOpenGLShader_*> *)0x173483,
                           (parameter_type)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
                QObject::connect(local_38,(char *)local_10,(QObject *)"2destroyed()",(char *)in_RDI,
                                 0x1df1fa);
                QMetaObject::Connection::~Connection((Connection *)local_38);
                local_39 = true;
              }
              else {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)this_00,
                           (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           line,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                ));
                QMessageLogger::warning
                          (local_30,
                           "QOpenGLShaderProgram::addShader: Program and shader are not associated with same context."
                          );
                local_39 = false;
              }
              goto LAB_001734be;
            }
          }
          local_39 = false;
          goto LAB_001734be;
        }
      }
      local_39 = false;
    }
  }
LAB_001734be:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::addShader(QOpenGLShader *shader)
{
    Q_D(QOpenGLShaderProgram);
    if (!init())
        return false;
    if (d->shaders.contains(shader))
        return true;    // Already added to this shader program.
    if (d->programGuard && d->programGuard->id() && shader) {
        if (!shader->d_func()->shaderGuard || !shader->d_func()->shaderGuard->id())
            return false;
        if (d->programGuard->group() != shader->d_func()->shaderGuard->group()) {
            qWarning("QOpenGLShaderProgram::addShader: Program and shader are not associated with same context.");
            return false;
        }
        d->glfuncs->glAttachShader(d->programGuard->id(), shader->d_func()->shaderGuard->id());
        d->linked = false;  // Program needs to be relinked.
        d->shaders.append(shader);
        connect(shader, SIGNAL(destroyed()), this, SLOT(shaderDestroyed()));
        return true;
    } else {
        return false;
    }
}